

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rigid-body-kinematics.hxx
# Opt level: O1

Orientation * __thiscall
stateObservation::kine::Orientation::integrate(Orientation *this,Vector3 *dt_x_omega)

{
  double dVar1;
  double dVar2;
  long lVar3;
  char *__function;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double local_98;
  undefined1 local_88 [48];
  double local_58 [6];
  double local_28;
  double dStack_20;
  double local_18;
  
  if ((this->q_).isSet_.b_ == false) {
    if ((this->m_).isSet_.b_ == false) {
      __assert_fail("(isQuaternionSet() || isMatrixSet()) && \"The orientation is not initialized\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/rigid-body-kinematics.hxx"
                    ,0x3ef,"void stateObservation::kine::Orientation::check_() const");
    }
    auVar7 = *(undefined1 (*) [16])
              (dt_x_omega->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array;
    local_98 = (dt_x_omega->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[2];
    dVar4 = local_98 * local_98 + auVar7._8_8_ * auVar7._8_8_ + auVar7._0_8_ * auVar7._0_8_;
    if (dVar4 <= 9.999999999999999e-33) {
      dVar4 = 0.0;
      local_88._0_16_ = ZEXT816(0);
      local_98 = 1.0;
    }
    else {
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      auVar8._8_8_ = dVar4;
      auVar8._0_8_ = dVar4;
      local_88._0_16_ = divpd(auVar7,auVar8);
      local_98 = local_98 / dVar4;
    }
    dVar9 = sin(dVar4);
    dVar4 = cos(dVar4);
    if (((this->m_).isSet_.b_ == true) && ((this->m_).assertMsg_.b_ != (char *)0x0)) {
      dVar15 = 1.0 - dVar4;
      dVar16 = dVar15 * (double)local_88._0_8_;
      dVar13 = local_98 * dVar15 * (double)local_88._8_8_;
      lVar3 = 0;
      do {
        dVar17 = *(double *)
                  ((long)(this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array + lVar3);
        dVar12 = *(double *)
                  ((long)(this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array + lVar3 + 8);
        dVar18 = *(double *)
                  ((long)(this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array + lVar3 + 0x10);
        *(double *)((long)local_58 + lVar3) =
             dVar18 * (dVar9 * (double)local_88._8_8_ + local_98 * dVar16) +
             dVar12 * ((double)local_88._8_8_ * dVar16 - local_98 * dVar9) +
             dVar17 * ((double)local_88._0_8_ * dVar16 + dVar4);
        *(double *)((long)local_58 + lVar3 + 8) =
             dVar18 * (dVar13 - dVar9 * (double)local_88._0_8_) +
             dVar12 * (dVar15 * (double)local_88._8_8_ * (double)local_88._8_8_ + dVar4) +
             dVar17 * ((double)local_88._8_8_ * dVar16 + local_98 * dVar9);
        *(double *)((long)local_58 + lVar3 + 0x10) =
             dVar18 * (local_98 * dVar15 * local_98 + dVar4) +
             (dVar13 + dVar9 * (double)local_88._0_8_) * dVar12 +
             (local_98 * dVar16 - dVar9 * (double)local_88._8_8_) * dVar17;
        lVar3 = lVar3 + 0x18;
      } while (lVar3 != 0x48);
LAB_0011a66f:
      (this->m_).isSet_.b_ = true;
      (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[0] = local_58[0];
      (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[1] = local_58[1];
      (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[2] = local_58[2];
      (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[3] = local_58[3];
      (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[4] = local_58[4];
      (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[5] = local_58[5];
      (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[6] = local_28;
      (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[7] = dStack_20;
      (this->m_).v_.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[8] = local_18;
      return this;
    }
LAB_0011a6d1:
    __function = 
    "bool stateObservation::CheckedItem<Eigen::Matrix<double, 3, 3>, false, false, true, true>::chckitm_check_() const [T = Eigen::Matrix<double, 3, 3>, lazy = false, alwaysCheck = false, assertion = true, eigenAlignedNew = true]"
    ;
  }
  else {
    auVar7 = *(undefined1 (*) [16])
              (dt_x_omega->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array;
    local_98 = (dt_x_omega->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[2];
    dVar4 = local_98 * local_98 + auVar7._8_8_ * auVar7._8_8_ + auVar7._0_8_ * auVar7._0_8_;
    if ((this->m_).isSet_.b_ == true) {
      dVar9 = 0.0;
      if (dVar4 <= 9.999999999999999e-33) {
        local_98 = 1.0;
        local_88._0_16_ = ZEXT816(0);
      }
      else {
        if (dVar4 < 0.0) {
          dVar4 = sqrt(dVar4);
        }
        else {
          dVar4 = SQRT(dVar4);
        }
        auVar5._8_8_ = dVar4;
        auVar5._0_8_ = dVar4;
        local_88._0_16_ = divpd(auVar7,auVar5);
        local_98 = local_98 / dVar4;
        dVar9 = dVar4 * 0.5;
      }
      dVar4 = cos(dVar9);
      dVar9 = sin(dVar9);
      if (((this->q_).isSet_.b_ == true) && ((this->q_).assertMsg_.b_ != (char *)0x0)) {
        local_98 = local_98 * dVar9;
        dVar18 = (double)local_88._0_8_ * dVar9;
        dVar9 = (double)local_88._8_8_ * dVar9;
        dVar13 = (this->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
                 .m_storage.m_data.array[0];
        dVar15 = *(double *)
                  ((long)(this->q_).v_.m_coeffs.
                         super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array + 8);
        dVar16 = *(double *)
                  ((long)(this->q_).v_.m_coeffs.
                         super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array + 0x10);
        dVar17 = *(double *)
                  ((long)(this->q_).v_.m_coeffs.
                         super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array + 0x18);
        dVar12 = local_98 * dVar13 - dVar18 * dVar16;
        auVar14._8_4_ = SUB84(dVar12,0);
        auVar14._0_8_ = local_98 * dVar15 - dVar18 * dVar17;
        auVar14._12_4_ = (int)((ulong)dVar12 >> 0x20);
        auVar14 = auVar14 ^ _DAT_001200c0;
        dVar12 = dVar18 * dVar13 + local_98 * dVar16;
        auVar10._8_4_ = SUB84(dVar12,0);
        auVar10._0_8_ = dVar18 * dVar15 + local_98 * dVar17;
        auVar10._12_4_ = (int)((ulong)dVar12 >> 0x20);
        auVar10 = auVar10 ^ _DAT_00120100;
        (this->q_).isSet_.b_ = true;
        (this->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
        m_storage.m_data.array[0] = auVar14._0_8_ + dVar9 * dVar16 + dVar4 * dVar13;
        *(double *)
         ((long)(this->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array + 8) = auVar14._8_8_ + dVar9 * dVar17 + dVar4 * dVar15;
        *(double *)
         ((long)(this->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array + 0x10) = auVar10._0_8_ + (dVar4 * dVar16 - dVar9 * dVar13);
        *(double *)
         ((long)(this->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array + 0x18) = auVar10._8_8_ + (dVar4 * dVar17 - dVar9 * dVar15);
        if (((this->m_).isSet_.b_ == true) && ((this->m_).assertMsg_.b_ != (char *)0x0)) {
          dVar15 = dVar9 + dVar9;
          dVar17 = local_98 + local_98;
          dVar16 = dVar4 * (dVar18 + dVar18);
          dVar13 = (dVar18 + dVar18) * dVar18;
          lVar3 = 0;
          do {
            dVar12 = *(double *)
                      ((long)(this->m_).v_.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                             m_data.array + lVar3);
            dVar1 = *(double *)
                     ((long)(this->m_).v_.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                            m_data.array + lVar3 + 8);
            dVar2 = *(double *)
                     ((long)(this->m_).v_.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                            m_data.array + lVar3 + 0x10);
            *(double *)((long)local_58 + lVar3) =
                 dVar2 * (dVar17 * dVar18 + dVar4 * dVar15) +
                 dVar1 * (dVar18 * dVar15 - dVar4 * dVar17) +
                 dVar12 * (1.0 - (dVar17 * local_98 + dVar15 * dVar9));
            *(double *)((long)local_58 + lVar3 + 8) =
                 dVar2 * (dVar9 * dVar17 - dVar16) +
                 dVar1 * (1.0 - (dVar17 * local_98 + dVar13)) +
                 dVar12 * (dVar18 * dVar15 + dVar4 * dVar17);
            *(double *)((long)local_58 + lVar3 + 0x10) =
                 dVar2 * (1.0 - (dVar15 * dVar9 + dVar13)) + (dVar9 * dVar17 + dVar16) * dVar1 +
                 (dVar17 * dVar18 - dVar4 * dVar15) * dVar12;
            lVar3 = lVar3 + 0x18;
          } while (lVar3 != 0x48);
          goto LAB_0011a66f;
        }
        goto LAB_0011a6d1;
      }
    }
    else {
      dVar9 = 0.0;
      if (dVar4 <= 9.999999999999999e-33) {
        local_98 = 1.0;
        local_88._0_16_ = ZEXT816(0);
      }
      else {
        if (dVar4 < 0.0) {
          dVar4 = sqrt(dVar4);
        }
        else {
          dVar4 = SQRT(dVar4);
        }
        auVar6._8_8_ = dVar4;
        auVar6._0_8_ = dVar4;
        local_88._0_16_ = divpd(auVar7,auVar6);
        local_98 = local_98 / dVar4;
        dVar9 = dVar4 * 0.5;
      }
      dVar4 = cos(dVar9);
      dVar9 = sin(dVar9);
      if (((this->q_).isSet_.b_ == true) && ((this->q_).assertMsg_.b_ != (char *)0x0)) {
        local_98 = local_98 * dVar9;
        dVar18 = (double)local_88._0_8_ * dVar9;
        dVar9 = (double)local_88._8_8_ * dVar9;
        dVar13 = (this->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
                 .m_storage.m_data.array[0];
        dVar15 = *(double *)
                  ((long)(this->q_).v_.m_coeffs.
                         super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array + 8);
        dVar16 = *(double *)
                  ((long)(this->q_).v_.m_coeffs.
                         super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array + 0x10);
        dVar17 = *(double *)
                  ((long)(this->q_).v_.m_coeffs.
                         super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                         m_data.array + 0x18);
        dVar12 = local_98 * dVar13 - dVar18 * dVar16;
        auVar11._8_4_ = SUB84(dVar12,0);
        auVar11._0_8_ = local_98 * dVar15 - dVar18 * dVar17;
        auVar11._12_4_ = (int)((ulong)dVar12 >> 0x20);
        auVar11 = auVar11 ^ _DAT_001200c0;
        dVar12 = dVar18 * dVar13 + local_98 * dVar16;
        auVar7._8_4_ = SUB84(dVar12,0);
        auVar7._0_8_ = dVar18 * dVar15 + local_98 * dVar17;
        auVar7._12_4_ = (int)((ulong)dVar12 >> 0x20);
        auVar7 = auVar7 ^ _DAT_00120100;
        (this->q_).isSet_.b_ = true;
        (this->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
        m_storage.m_data.array[0] = auVar11._0_8_ + dVar9 * dVar16 + dVar4 * dVar13;
        *(double *)
         ((long)(this->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array + 8) = auVar11._8_8_ + dVar9 * dVar17 + dVar4 * dVar15;
        *(double *)
         ((long)(this->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array + 0x10) = auVar7._0_8_ + (dVar4 * dVar16 - dVar9 * dVar13);
        *(double *)
         ((long)(this->q_).v_.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array + 0x18) = auVar7._8_8_ + (dVar4 * dVar17 - dVar9 * dVar15);
        return this;
      }
    }
    __function = 
    "bool stateObservation::CheckedItem<Eigen::Quaternion<double>, false, false, true, true>::chckitm_check_() const [T = Eigen::Quaternion<double>, lazy = false, alwaysCheck = false, assertion = true, eigenAlignedNew = true]"
    ;
  }
  __assert_fail("(isSet())&&(assertMsg_.get())",
                "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/definitions.hxx"
                ,0x69,__function);
}

Assistant:

inline const Orientation & Orientation::integrate(Vector3 dt_x_omega)
{
  check_();
  if(q_.isSet())
  {
    if(isMatrixSet())
    {
      Quaternion q = kine::rotationVectorToQuaternion(dt_x_omega);
      q_ = q * q_();
      m_ = q.toRotationMatrix() * m_();
    }
    else
    {
      q_ = kine::rotationVectorToQuaternion(dt_x_omega) * q_();
    }
  }
  else
  {
    m_ = kine::rotationVectorToRotationMatrix(dt_x_omega) * m_();
  }
  return *this;
}